

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  ushort uVar1;
  uint uVar2;
  ExprList *pEList;
  bool bVar3;
  int iVar4;
  int iVar5;
  ExprList_item *pEVar6;
  undefined8 in_R9;
  uint uVar7;
  undefined8 uVar8;
  
  iVar4 = 0;
  iVar5 = 0;
  if (pOrderBy != (ExprList *)0x0) {
    uVar8 = 0;
    iVar5 = iVar4;
    if ((pParse->db->mallocFailed == '\0') && (pParse->eParseMode < 2)) {
      if (pParse->db->aLimit[2] < pOrderBy->nExpr) {
        sqlite3ErrorMsg(pParse,"too many terms in %s BY clause",zType);
LAB_00187c34:
        iVar5 = 1;
      }
      else if (0 < pOrderBy->nExpr) {
        pEList = pSelect->pEList;
        pEVar6 = pOrderBy->a;
        uVar7 = 1;
        do {
          uVar1 = (pEVar6->u).x.iOrderByCol;
          if (uVar1 != 0) {
            uVar2 = pEList->nExpr;
            if ((int)uVar2 < (int)(uint)uVar1) {
              sqlite3ErrorMsg(pParse,"%r %s BY term out of range - should be between 1 and %d",
                              (ulong)uVar7,zType,(ulong)uVar2,in_R9,uVar8);
              goto LAB_00187c34;
            }
            resolveAlias(pParse,pEList,uVar1 - 1,pEVar6->pExpr,0);
          }
          pEVar6 = pEVar6 + 1;
          iVar5 = 0;
          bVar3 = (int)uVar7 < pOrderBy->nExpr;
          uVar7 = uVar7 + 1;
        } while (bVar3);
      }
    }
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed || IN_RENAME_OBJECT ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr, 0);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,0);
    }
  }
  return 0;
}